

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O0

_Bool borg_equips_item(int activation,_Bool check_charge)

{
  borg_item_conflict *item;
  int i;
  _Bool check_charge_local;
  int activation_local;
  
  if (borg.activation[activation] == 0) {
    check_charge_local = false;
  }
  else if (check_charge) {
    for (item._0_4_ = (uint)z_info->pack_size; (int)(uint)item < (int)(z_info->pack_size + 0xc);
        item._0_4_ = (uint)item + 1) {
      if (((borg_items[(int)(uint)item].iqty != '\0') &&
          (borg_items[(int)(uint)item].activ_idx == activation)) &&
         ((!check_charge || (borg_items[(int)(uint)item].timeout < 1)))) {
        return true;
      }
    }
    check_charge_local = false;
  }
  else {
    check_charge_local = true;
  }
  return check_charge_local;
}

Assistant:

bool borg_equips_item(int activation, bool check_charge)
{
    int i;

    /* a quick check of the array */
    if (!borg.activation[activation])
        return false;
    else if (!check_charge)
        return true;

    /* Check the equipment */
    for (i = INVEN_WIELD; i < INVEN_TOTAL; i++) {
        borg_item *item = &borg_items[i];

        if (!item->iqty)
            continue;

        /* Skip wrong activation */
        if (item->activ_idx != activation)
            continue;

        /* Check charge.  */
        if (check_charge && (item->timeout >= 1))
            continue;

        /* Success */
        return true;
    }

    /* I do not have it or it is not charged */
    return false;
}